

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

bool re2::RE2::Arg::parse_long_radix(char *str,int n,void *dest,int radix)

{
  char *__nptr;
  int *piVar1;
  long lVar2;
  char *end;
  char buf [33];
  int local_6c;
  long *local_68;
  char *local_60;
  char local_58 [40];
  
  if (n != 0) {
    local_6c = n;
    local_68 = (long *)dest;
    __nptr = TerminateNumber(local_58,0x21,str,&local_6c,false);
    piVar1 = __errno_location();
    *piVar1 = 0;
    lVar2 = strtol(__nptr,&local_60,radix);
    if (local_60 != __nptr + local_6c) {
      return false;
    }
    if (*piVar1 == 0) {
      if (local_68 == (long *)0x0) {
        return true;
      }
      *local_68 = lVar2;
      return true;
    }
  }
  return false;
}

Assistant:

bool RE2::Arg::parse_long_radix(const char* str,
                               int n,
                               void* dest,
                               int radix) {
  if (n == 0) return false;
  char buf[kMaxNumberLength+1];
  str = TerminateNumber(buf, sizeof buf, str, &n, false);
  char* end;
  errno = 0;
  long r = strtol(str, &end, radix);
  if (end != str + n) return false;   // Leftover junk
  if (errno) return false;
  if (dest == NULL) return true;
  *(reinterpret_cast<long*>(dest)) = r;
  return true;
}